

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O0

Status __thiscall spvtools::opt::WrapOpKill::Process(WrapOpKill *this)

{
  bool bVar1;
  IRContext *pIVar2;
  StructuredCFGAnalysis *this_00;
  reference puVar3;
  Function *this_01;
  anon_class_16_2_0e352904 local_b8;
  function<bool_(spvtools::opt::Instruction_*)> local_a8;
  undefined1 local_81;
  Function *pFStack_80;
  bool successful;
  Function *func;
  _Node_iterator_base<unsigned_int,_false> _Stack_70;
  uint32_t func_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  func_to_process;
  bool modified;
  WrapOpKill *this_local;
  
  func_to_process._M_h._M_single_bucket._7_1_ = 0;
  pIVar2 = Pass::context(&this->super_Pass);
  this_00 = IRContext::GetStructuredCFGAnalysis(pIVar2);
  StructuredCFGAnalysis::FindFuncsCalledFromContinue
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2,this_00);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  _Stack_70._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff90);
    if (!bVar1) {
      bVar1 = std::operator!=(&this->opkill_function_,(nullptr_t)0x0);
      if (bVar1) {
        if ((func_to_process._M_h._M_single_bucket._7_1_ & 1) == 0) {
          __assert_fail("modified && \"The function should only be generated if something was modified.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                        ,0x30,"virtual Pass::Status spvtools::opt::WrapOpKill::Process()");
        }
        pIVar2 = Pass::context(&this->super_Pass);
        IRContext::AddFunction(pIVar2,&this->opkill_function_);
      }
      bVar1 = std::operator!=(&this->opterminateinvocation_function_,(nullptr_t)0x0);
      if (bVar1) {
        if ((func_to_process._M_h._M_single_bucket._7_1_ & 1) == 0) {
          __assert_fail("modified && \"The function should only be generated if something was modified.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                        ,0x35,"virtual Pass::Status spvtools::opt::WrapOpKill::Process()");
        }
        pIVar2 = Pass::context(&this->super_Pass);
        IRContext::AddFunction(pIVar2,&this->opterminateinvocation_function_);
      }
      this_local._4_4_ = SuccessWithoutChange;
      if ((func_to_process._M_h._M_single_bucket._7_1_ & 1) != 0) {
        this_local._4_4_ = SuccessWithChange;
      }
LAB_00894c2e:
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2);
      return this_local._4_4_;
    }
    puVar3 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    func._4_4_ = *puVar3;
    pIVar2 = Pass::context(&this->super_Pass);
    this_01 = IRContext::GetFunction(pIVar2,func._4_4_);
    local_b8.modified = (bool *)((long)&func_to_process._M_h._M_single_bucket + 7);
    local_b8.this = this;
    pFStack_80 = this_01;
    std::function<bool(spvtools::opt::Instruction*)>::
    function<spvtools::opt::WrapOpKill::Process()::__0,void>
              ((function<bool(spvtools::opt::Instruction*)> *)&local_a8,&local_b8);
    bVar1 = opt::Function::WhileEachInst(this_01,&local_a8,false,false);
    std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_a8);
    local_81 = bVar1;
    if (!bVar1) {
      this_local._4_4_ = Failure;
      goto LAB_00894c2e;
    }
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  } while( true );
}

Assistant:

Pass::Status WrapOpKill::Process() {
  bool modified = false;

  auto func_to_process =
      context()->GetStructuredCFGAnalysis()->FindFuncsCalledFromContinue();
  for (uint32_t func_id : func_to_process) {
    Function* func = context()->GetFunction(func_id);
    bool successful = func->WhileEachInst([this, &modified](Instruction* inst) {
      const auto opcode = inst->opcode();
      if ((opcode == spv::Op::OpKill) ||
          (opcode == spv::Op::OpTerminateInvocation)) {
        modified = true;
        if (!ReplaceWithFunctionCall(inst)) {
          return false;
        }
      }
      return true;
    });

    if (!successful) {
      return Status::Failure;
    }
  }

  if (opkill_function_ != nullptr) {
    assert(modified &&
           "The function should only be generated if something was modified.");
    context()->AddFunction(std::move(opkill_function_));
  }
  if (opterminateinvocation_function_ != nullptr) {
    assert(modified &&
           "The function should only be generated if something was modified.");
    context()->AddFunction(std::move(opterminateinvocation_function_));
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}